

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O1

int Get5TelemetersParallelSRF02
              (SRF02 *pSRF02,double *pDist1,double *pDist2,double *pDist3,double *pDist4,
              double *pDist5)

{
  int iVar1;
  timespec req;
  timespec local_40;
  
  iVar1 = SendRangeRequestSRF02(pSRF02,0);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = SendRangeRequestSRF02(pSRF02,1);
  if ((((iVar1 == 0) && (iVar1 = SendRangeRequestSRF02(pSRF02,2), iVar1 == 0)) &&
      (iVar1 = SendRangeRequestSRF02(pSRF02,3), iVar1 == 0)) &&
     (iVar1 = SendRangeRequestSRF02(pSRF02,4), iVar1 == 0)) {
    local_40.tv_sec = (long)pSRF02->RangingDelay / 1000;
    local_40.tv_nsec = ((long)pSRF02->RangingDelay % 1000) * 1000000;
    nanosleep(&local_40,(timespec *)0x0);
    iVar1 = RangeReplySRF02(pSRF02,0,pDist1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = RangeReplySRF02(pSRF02,1,pDist2);
    if ((iVar1 == 0) && (iVar1 = RangeReplySRF02(pSRF02,2,pDist3), iVar1 == 0)) {
      iVar1 = RangeReplySRF02(pSRF02,3,pDist4);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = RangeReplySRF02(pSRF02,4,pDist5);
      return (uint)(iVar1 != 0);
    }
  }
  return 1;
}

Assistant:

inline int Get5TelemetersParallelSRF02(SRF02* pSRF02, double* pDist1, double* pDist2, double* pDist3, double* pDist4, double* pDist5)
{
	if (SendRangeRequestSRF02(pSRF02, 0) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 1) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 2) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 3) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 4) != EXIT_SUCCESS) return EXIT_FAILURE;
	mSleep(pSRF02->RangingDelay);
	if (RangeReplySRF02(pSRF02, 0, pDist1) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 1, pDist2) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 2, pDist3) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 3, pDist4) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 4, pDist5) != EXIT_SUCCESS) return EXIT_FAILURE;

	return EXIT_SUCCESS;
}